

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExact.c
# Opt level: O0

int cuddExact(DdManager *table,int lower,int upper)

{
  DdHalfWord DVar1;
  DdHalfWord *order_00;
  DdHalfWord **ppDVar2;
  DdHalfWord **ppDVar3;
  bool bVar4;
  int iVar5;
  int cols;
  int iVar6;
  int iVar7;
  int iVar8;
  DdHalfWord *order;
  DdHalfWord *bestOrder;
  int *tmpCost;
  DdHalfWord **tmpOrder;
  int *oldCost;
  int *newCost;
  DdHalfWord **oldOrder;
  DdHalfWord **newOrder;
  DdHalfWord *symmInfo;
  char *mask;
  int roots;
  int cost;
  int lowerBound;
  int upperBound;
  int result;
  int level;
  int nvars;
  int unused;
  int size;
  int subsetCost;
  int newSubsets;
  int oldSubsets;
  int maxBinomial;
  int j;
  int i;
  int k;
  int upper_local;
  int lower_local;
  DdManager *table_local;
  
  symmInfo = (DdHalfWord *)0x0;
  newOrder = (DdHalfWord **)0x0;
  oldOrder = (DdHalfWord **)0x0;
  newCost = (int *)0x0;
  oldCost = (int *)0x0;
  tmpOrder = (DdHalfWord **)0x0;
  order = (DdHalfWord *)0x0;
  k = lower;
  while( true ) {
    bVar4 = false;
    if ((table->subtables[k].keys == 1) && (bVar4 = false, table->vars[table->invperm[k]]->ref == 1)
       ) {
      bVar4 = k < upper;
    }
    i = upper;
    if (!bVar4) break;
    k = k + 1;
  }
  while( true ) {
    bVar4 = false;
    if ((table->subtables[i].keys == 1) && (bVar4 = false, table->vars[table->invperm[i]]->ref == 1)
       ) {
      bVar4 = k < i;
    }
    if (!bVar4) break;
    i = i + -1;
  }
  if (k == i) {
    table_local._4_4_ = 1;
  }
  else {
    iVar5 = cuddSymmSiftingConv(table,k,i);
    if (iVar5 != 0) {
      iVar5 = table->size;
      cols = (i - k) + 1;
      level = 0;
      maxBinomial = k;
      while (maxBinomial = maxBinomial + 1, maxBinomial < i) {
        if ((table->subtables[maxBinomial].keys == 1) &&
           (table->vars[table->invperm[maxBinomial]]->ref == 1)) {
          level = level + 1;
        }
      }
      iVar6 = getMaxBinomial(cols - level);
      if (((((iVar6 != -1) && (oldOrder = getMatrix(iVar6,cols), oldOrder != (DdHalfWord **)0x0)) &&
           (oldCost = (int *)malloc((long)iVar6 << 2), oldCost != (int *)0x0)) &&
          ((newCost = (int *)getMatrix(iVar6,cols), (DdHalfWord **)newCost != (DdHalfWord **)0x0 &&
           (tmpOrder = (DdHalfWord **)malloc((long)iVar6 << 2), tmpOrder != (DdHalfWord **)0x0))))
         && ((order = (DdHalfWord *)malloc((long)cols << 2), order != (DdHalfWord *)0x0 &&
             ((symmInfo = (DdHalfWord *)malloc((long)iVar5), symmInfo != (DdHalfWord *)0x0 &&
              (newOrder = (DdHalfWord **)initSymmInfo(table,k,i), newOrder != (DdHalfWord **)0x0))))
            )) {
        iVar6 = ddCountRoots(table,k,i);
        subsetCost = 1;
        for (maxBinomial = 0; maxBinomial < cols; maxBinomial = maxBinomial + 1) {
          DVar1 = table->invperm[maxBinomial + k];
          order[maxBinomial] = DVar1;
          (*(DdHalfWord **)newCost)[maxBinomial] = DVar1;
        }
        unused = (table->constants).keys;
        maxBinomial = i;
        while (maxBinomial = maxBinomial + 1, maxBinomial < iVar5) {
          iVar7 = getLevelKeys(table,maxBinomial);
          unused = iVar7 + unused;
        }
        *(int *)tmpOrder = unused;
        cost = table->keys - table->isolated;
        for (j = 1; j <= cols; j = j + 1) {
          size = 0;
          iVar5 = cols - j;
          for (maxBinomial = 0; maxBinomial < subsetCost; maxBinomial = maxBinomial + 1) {
            order_00 = *(DdHalfWord **)(newCost + (long)maxBinomial * 2);
            iVar7 = *(int *)((long)tmpOrder + (long)maxBinomial * 4);
            iVar8 = computeLB(table,order_00,iVar6,iVar7,k,i,iVar5);
            if (iVar8 < cost) {
              iVar8 = ddShuffle(table,order_00,k,i);
              if (iVar8 == 0) goto LAB_00a00d8f;
              cost = updateUB(table,cost,order,k,i);
              for (oldSubsets = iVar5; -1 < oldSubsets; oldSubsets = oldSubsets + -1) {
                if ((table->subtables[oldSubsets + k + -1].keys != 1) ||
                   (table->vars[table->invperm[oldSubsets + k + -1]]->ref != 1)) {
                  iVar8 = getLevelKeys(table,k + iVar5);
                  size = updateEntry(table,order_00,iVar5,iVar7 + iVar8,oldOrder,oldCost,size,
                                     (char *)symmInfo,k,i);
                  if (oldSubsets == 0) break;
                  iVar8 = checkSymmInfo(table,(DdHalfWord *)newOrder,order_00[oldSubsets + -1],iVar5
                                       );
                  if (iVar8 != 0) {
                    pushDown(order_00,oldSubsets + -1,iVar5);
                    iVar8 = ddShuffle(table,order_00,k,i);
                    if (iVar8 == 0) goto LAB_00a00d8f;
                    cost = updateUB(table,cost,order,k,i);
                  }
                }
              }
            }
          }
          ppDVar2 = oldOrder;
          ppDVar3 = (DdHalfWord **)oldCost;
          oldOrder = (DdHalfWord **)newCost;
          oldCost = (int *)tmpOrder;
          subsetCost = size;
          tmpOrder = ppDVar3;
          newCost = (int *)ppDVar2;
        }
        iVar5 = ddShuffle(table,order,k,i);
        if (iVar5 != 0) {
          freeMatrix(oldOrder);
          freeMatrix((DdHalfWord **)newCost);
          if (order != (DdHalfWord *)0x0) {
            free(order);
          }
          if (tmpOrder != (DdHalfWord **)0x0) {
            free(tmpOrder);
          }
          if (oldCost != (int *)0x0) {
            free(oldCost);
          }
          if (newOrder != (DdHalfWord **)0x0) {
            free(newOrder);
          }
          if (symmInfo != (DdHalfWord *)0x0) {
            free(symmInfo);
          }
          return 1;
        }
      }
    }
LAB_00a00d8f:
    if (oldOrder != (DdHalfWord **)0x0) {
      freeMatrix(oldOrder);
    }
    if (newCost != (int *)0x0) {
      freeMatrix((DdHalfWord **)newCost);
    }
    if ((order != (DdHalfWord *)0x0) && (order != (DdHalfWord *)0x0)) {
      free(order);
    }
    if ((tmpOrder != (DdHalfWord **)0x0) && (tmpOrder != (DdHalfWord **)0x0)) {
      free(tmpOrder);
    }
    if ((oldCost != (int *)0x0) && (oldCost != (int *)0x0)) {
      free(oldCost);
    }
    if ((newOrder != (DdHalfWord **)0x0) && (newOrder != (DdHalfWord **)0x0)) {
      free(newOrder);
    }
    if ((symmInfo != (DdHalfWord *)0x0) && (symmInfo != (DdHalfWord *)0x0)) {
      free(symmInfo);
    }
    table->errorCode = CUDD_MEMORY_OUT;
    table_local._4_4_ = 0;
  }
  return table_local._4_4_;
}

Assistant:

int
cuddExact(
  DdManager * table,
  int  lower,
  int  upper)
{
    int k, i, j;
    int maxBinomial, oldSubsets, newSubsets;
    int subsetCost;
    int size;                   /* number of variables to be reordered */
    int unused, nvars, level, result;
    int upperBound, lowerBound, cost;
    int roots;
    char *mask = NULL;
    DdHalfWord  *symmInfo = NULL;
    DdHalfWord **newOrder = NULL;
    DdHalfWord **oldOrder = NULL;
    int *newCost = NULL;
    int *oldCost = NULL;
    DdHalfWord **tmpOrder;
    int *tmpCost;
    DdHalfWord *bestOrder = NULL;
    DdHalfWord *order;
#ifdef DD_STATS
    int  ddTotalSubsets;
#endif

    /* Restrict the range to be reordered by excluding unused variables
    ** at the two ends. */
    while (table->subtables[lower].keys == 1 &&
           table->vars[table->invperm[lower]]->ref == 1 &&
           lower < upper)
        lower++;
    while (table->subtables[upper].keys == 1 &&
           table->vars[table->invperm[upper]]->ref == 1 &&
           lower < upper)
        upper--;
    if (lower == upper) return(1); /* trivial problem */

    /* Apply symmetric sifting to get a good upper bound and to extract
    ** symmetry information. */
    result = cuddSymmSiftingConv(table,lower,upper);
    if (result == 0) goto cuddExactOutOfMem;

#ifdef DD_STATS
    (void) fprintf(table->out,"\n");
    ddTotalShuffles = 0;
    ddTotalSubsets = 0;
#endif

    /* Initialization. */
    nvars = table->size;
    size = upper - lower + 1;
    /* Count unused variable among those to be reordered.  This is only
    ** used to compute maxBinomial. */
    unused = 0;
    for (i = lower + 1; i < upper; i++) {
        if (table->subtables[i].keys == 1 &&
            table->vars[table->invperm[i]]->ref == 1)
            unused++;
    }

    /* Find the maximum number of subsets we may have to store. */
    maxBinomial = getMaxBinomial(size - unused);
    if (maxBinomial == -1) goto cuddExactOutOfMem;

    newOrder = getMatrix(maxBinomial, size);
    if (newOrder == NULL) goto cuddExactOutOfMem;

    newCost = ABC_ALLOC(int, maxBinomial);
    if (newCost == NULL) goto cuddExactOutOfMem;

    oldOrder = getMatrix(maxBinomial, size);
    if (oldOrder == NULL) goto cuddExactOutOfMem;

    oldCost = ABC_ALLOC(int, maxBinomial);
    if (oldCost == NULL) goto cuddExactOutOfMem;

    bestOrder = ABC_ALLOC(DdHalfWord, size);
    if (bestOrder == NULL) goto cuddExactOutOfMem;

    mask = ABC_ALLOC(char, nvars);
    if (mask == NULL) goto cuddExactOutOfMem;

    symmInfo = initSymmInfo(table, lower, upper);
    if (symmInfo == NULL) goto cuddExactOutOfMem;

    roots = ddCountRoots(table, lower, upper);

    /* Initialize the old order matrix for the empty subset and the best
    ** order to the current order. The cost for the empty subset includes
    ** the cost of the levels between upper and the constants. These levels
    ** are not going to change. Hence, we count them only once.
    */
    oldSubsets = 1;
    for (i = 0; i < size; i++) {
        oldOrder[0][i] = bestOrder[i] = (DdHalfWord) table->invperm[i+lower];
    }
    subsetCost = table->constants.keys;
    for (i = upper + 1; i < nvars; i++)
        subsetCost += getLevelKeys(table,i);
    oldCost[0] = subsetCost;
    /* The upper bound is initialized to the current size of the BDDs. */
    upperBound = table->keys - table->isolated;

    /* Now consider subsets of increasing size. */
    for (k = 1; k <= size; k++) {
#ifdef DD_STATS
        (void) fprintf(table->out,"Processing subsets of size %d\n", k);
        fflush(table->out);
#endif
        newSubsets = 0;
        level = size - k;               /* offset of first bottom variable */

        for (i = 0; i < oldSubsets; i++) { /* for each subset of size k-1 */
            order = oldOrder[i];
            cost = oldCost[i];
            lowerBound = computeLB(table, order, roots, cost, lower, upper,
                                   level);
            if (lowerBound >= upperBound)
                continue;
            /* Impose new order. */
            result = ddShuffle(table, order, lower, upper);
            if (result == 0) goto cuddExactOutOfMem;
            upperBound = updateUB(table,upperBound,bestOrder,lower,upper);
            /* For each top bottom variable. */
            for (j = level; j >= 0; j--) {
                /* Skip unused variables. */
                if (table->subtables[j+lower-1].keys == 1 &&
                    table->vars[table->invperm[j+lower-1]]->ref == 1) continue;
                /* Find cost under this order. */
                subsetCost = cost + getLevelKeys(table, lower + level);
                newSubsets = updateEntry(table, order, level, subsetCost,
                                         newOrder, newCost, newSubsets, mask,
                                         lower, upper);
                if (j == 0)
                    break;
                if (checkSymmInfo(table, symmInfo, order[j-1], level) == 0)
                    continue;
                pushDown(order,j-1,level);
                /* Impose new order. */
                result = ddShuffle(table, order, lower, upper);
                if (result == 0) goto cuddExactOutOfMem;
                upperBound = updateUB(table,upperBound,bestOrder,lower,upper);
            } /* for each bottom variable */
        } /* for each subset of size k */

        /* New orders become old orders in preparation for next iteration. */
        tmpOrder = oldOrder; tmpCost = oldCost;
        oldOrder = newOrder; oldCost = newCost;
        newOrder = tmpOrder; newCost = tmpCost;
#ifdef DD_STATS
        ddTotalSubsets += newSubsets;
#endif
        oldSubsets = newSubsets;
    }
    result = ddShuffle(table, bestOrder, lower, upper);
    if (result == 0) goto cuddExactOutOfMem;
#ifdef DD_STATS
#ifdef DD_VERBOSE
    (void) fprintf(table->out,"\n");
#endif
    (void) fprintf(table->out,"#:S_EXACT   %8d: total subsets\n",
                   ddTotalSubsets);
    (void) fprintf(table->out,"#:H_EXACT   %8d: total shuffles",
                   ddTotalShuffles);
#endif

    freeMatrix(newOrder);
    freeMatrix(oldOrder);
    ABC_FREE(bestOrder);
    ABC_FREE(oldCost);
    ABC_FREE(newCost);
    ABC_FREE(symmInfo);
    ABC_FREE(mask);
    return(1);

cuddExactOutOfMem:

    if (newOrder != NULL) freeMatrix(newOrder);
    if (oldOrder != NULL) freeMatrix(oldOrder);
    if (bestOrder != NULL) ABC_FREE(bestOrder);
    if (oldCost != NULL) ABC_FREE(oldCost);
    if (newCost != NULL) ABC_FREE(newCost);
    if (symmInfo != NULL) ABC_FREE(symmInfo);
    if (mask != NULL) ABC_FREE(mask);
    table->errorCode = CUDD_MEMORY_OUT;
    return(0);

}